

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_byte_string(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                 byte_string_view *b,semantic_tag tag,ser_context *param_4,error_code *param_5)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  map<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
  *this_00;
  char in_DL;
  byte_string_view *in_RSI;
  uint64_t in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>,_bool>
  pVar4;
  iterator it;
  byte_string_type bs;
  byte_string_chars_format encoding_hint;
  allocator<unsigned_char> *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>
  *in_stack_fffffffffffffef8;
  basic_byte_string<std::allocator<unsigned_char>_> *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff40;
  byte_string_view *in_stack_ffffffffffffff68;
  byte_string_view *b_00;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_ffffffffffffff70
  ;
  _Self local_70;
  _Self local_68 [7];
  char local_29;
  byte_string_view *local_10;
  
  if (in_DL == '\b') {
    local_29 = '\x01';
  }
  else if (in_DL == '\t') {
    local_29 = '\x02';
  }
  else if (in_DL == '\f') {
    local_29 = '\x03';
  }
  else {
    local_29 = '\0';
  }
  local_10 = in_RSI;
  if (local_29 == '\x01') {
    write_tag((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
              CONCAT17(in_DL,in_stack_ffffffffffffff40),in_RDI);
  }
  else if (local_29 == '\x02') {
    write_tag((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
              CONCAT17(in_DL,in_stack_ffffffffffffff40),in_RDI);
  }
  else if (local_29 == '\x03') {
    write_tag((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
              CONCAT17(in_DL,in_stack_ffffffffffffff40),in_RDI);
  }
  bVar1 = cbor_encode_options::pack_strings((cbor_encode_options *)(in_RDI + 0x40));
  if (bVar1) {
    sVar2 = byte_string_view::size(local_10);
    sVar3 = detail::min_length_for_stringref(*(uint64_t *)(in_RDI + 0xe0));
    if (sVar3 <= sVar2) {
      byte_string_view::data(local_10);
      byte_string_view::size(local_10);
      std::allocator<unsigned_char>::allocator<char>
                ((allocator<unsigned_char> *)
                 CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 (allocator<char> *)in_stack_fffffffffffffee8);
      basic_byte_string<std::allocator<unsigned_char>_>::basic_byte_string
                (in_stack_ffffffffffffff00,(uint8_t *)in_stack_fffffffffffffef8,
                 CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x30cbaa);
      local_68[0]._M_node =
           (_Base_ptr)
           std::
           map<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
           ::find((map<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
                   *)in_stack_fffffffffffffee8,(key_type *)0x30cbc3);
      local_70._M_node =
           (_Base_ptr)
           std::
           map<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
           ::end((map<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
                  *)in_stack_fffffffffffffee8);
      bVar1 = std::operator==(local_68,&local_70);
      if (bVar1) {
        this_00 = (map<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
                   *)(in_RDI + 0xb0);
        b_00 = *(byte_string_view **)(in_RDI + 0xe0);
        *(undefined1 **)(in_RDI + 0xe0) = (undefined1 *)((long)&b_00->data_ + 1);
        std::make_pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>&,unsigned_long>
                  (&in_stack_fffffffffffffef8->first,
                   (unsigned_long *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
        pVar4 = std::
                map<jsoncons::basic_byte_string<std::allocator<unsigned_char>>,unsigned_long,std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>>>,std::allocator<std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>const,unsigned_long>>>
                ::
                emplace<std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>,unsigned_long>>
                          (this_00,in_stack_fffffffffffffef8);
        in_stack_fffffffffffffef7 = pVar4.second;
        std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>::~pair
                  ((pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>
                    *)0x30cc98);
        byte_string_view::byte_string_view<std::allocator<unsigned_char>>
                  ((byte_string_view *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0)
                   ,(basic_byte_string<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffee8);
        write_byte_string(in_stack_ffffffffffffff70,b_00);
      }
      else {
        write_tag((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                  CONCAT17(in_DL,in_stack_ffffffffffffff40),in_RDI);
        std::
        _Rb_tree_iterator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>
        ::operator*((_Rb_tree_iterator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>
                     *)0x30cd3f);
        write_uint64_value((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>
                            *)CONCAT17(in_DL,in_stack_ffffffffffffff40),in_RDI);
      }
      basic_byte_string<std::allocator<unsigned_char>_>::~basic_byte_string
                ((basic_byte_string<std::allocator<unsigned_char>_> *)0x30cd5e);
      goto LAB_0030cd81;
    }
  }
  write_byte_string(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
LAB_0030cd81:
  end_value((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
            CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_byte_string(const byte_string_view& b, 
                           semantic_tag tag, 
                           const ser_context&,
                           std::error_code&) override
    {
        byte_string_chars_format encoding_hint;
        switch (tag)
        {
            case semantic_tag::base16:
                encoding_hint = byte_string_chars_format::base16;
                break;
            case semantic_tag::base64:
                encoding_hint = byte_string_chars_format::base64;
                break;
            case semantic_tag::base64url:
                encoding_hint = byte_string_chars_format::base64url;
                break;
            default:
                encoding_hint = byte_string_chars_format::none;
                break;
        }
        switch (encoding_hint)
        {
            case byte_string_chars_format::base64url:
                write_tag(21);
                break;
            case byte_string_chars_format::base64:
                write_tag(22);
                break;
            case byte_string_chars_format::base16:
                write_tag(23);
                break;
            default:
                break;
        }
        if (options_.pack_strings() && b.size() >= jsoncons::cbor::detail::min_length_for_stringref(next_stringref_))
        {
            byte_string_type bs(b.data(), b.size(), alloc_);
            auto it = bytestringref_map_.find(bs);
            if (it == bytestringref_map_.end())
            {
                bytestringref_map_.emplace(std::make_pair(bs, next_stringref_++));
                write_byte_string(bs);
            }
            else
            {
                write_tag(25);
                write_uint64_value((*it).second);
            }
        }
        else
        {
            write_byte_string(b);
        }

        end_value();
        JSONCONS_VISITOR_RETURN;
    }